

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

bool mjs::interpreter::impl::handle_completion(completion *c,label_set *labels)

{
  bool bVar1;
  completion local_b0;
  completion local_60;
  label_set *local_20;
  label_set *labels_local;
  completion *c_local;
  
  local_20 = labels;
  labels_local = (label_set *)c;
  if (c->type == break_) {
    bVar1 = completion::has_target(c);
    if (!bVar1) {
      __assert_fail("c.has_target()",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                    ,0x363,
                    "static bool mjs::interpreter::impl::handle_completion(completion &, const label_set &)"
                   );
    }
    bVar1 = completion::in_set((completion *)labels_local,local_20);
    if (bVar1) {
      completion::completion(&local_60,(value *)value::undefined,normal);
      completion::operator=((completion *)labels_local,&local_60);
      completion::~completion(&local_60);
    }
    c_local._7_1_ = true;
  }
  else if ((c->type == return_) || (c->type == throw_)) {
    c_local._7_1_ = true;
  }
  else {
    if (c->type == continue_) {
      bVar1 = completion::has_target(c);
      if (!bVar1) {
        __assert_fail("c.has_target()",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                      ,0x36b,
                      "static bool mjs::interpreter::impl::handle_completion(completion &, const label_set &)"
                     );
      }
      bVar1 = completion::in_set((completion *)labels_local,local_20);
      if (!bVar1) {
        return true;
      }
      completion::completion(&local_b0,(value *)value::undefined,normal);
      completion::operator=((completion *)labels_local,&local_b0);
      completion::~completion(&local_b0);
    }
    else if (c->type != normal) {
      __assert_fail("c.type == completion_type::normal",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                    ,0x371,
                    "static bool mjs::interpreter::impl::handle_completion(completion &, const label_set &)"
                   );
    }
    c_local._7_1_ = false;
  }
  return c_local._7_1_;
}

Assistant:

static bool handle_completion(completion& c, const label_set& labels) {
        if (c.type == completion_type::break_) {
            assert(c.has_target());
            if (c.in_set(labels)) {
                c = completion{};
            }
            return true;
        } else if (c.type == completion_type::return_ || c.type == completion_type::throw_) {
            return true;
        } else if (c.type == completion_type::continue_) {
            assert(c.has_target());
            if (!c.in_set(labels)) {
                return true;
            }
            c = completion{};
        } else {
            assert(c.type == completion_type::normal);
        }
        return false;
    }